

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

void __thiscall
vmips::Function::
call_void<std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
          (Function *this,weak_ptr<vmips::Function> *target,shared_ptr<vmips::VirtReg> *args,
          shared_ptr<vmips::VirtReg> *args_1,shared_ptr<vmips::VirtReg> *args_2)

{
  ulong uVar1;
  long lVar2;
  initializer_list<std::shared_ptr<vmips::VirtReg>_> __l;
  allocator_type local_99;
  weak_ptr<vmips::Function> local_98;
  shared_ptr<vmips::callfunc> calling;
  __shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> local_58;
  vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  local_48;
  
  this[0x108] = (Function)0x1;
  std::__shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_78);
  uVar1 = *(ulong *)(local_78._M_ptr + 0x128);
  if (*(ulong *)(local_78._M_ptr + 0x128) < *(ulong *)(this + 0x110)) {
    uVar1 = *(ulong *)(this + 0x110);
  }
  *(ulong *)(this + 0x110) = uVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  local_98.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> *)&local_78,
             &args->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,&args_1->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&args_2->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_78;
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  vector(&local_48,__l,&local_99);
  std::
  make_shared<vmips::callfunc,decltype(nullptr),vmips::Function*,std::weak_ptr<vmips::Function>,std::vector<std::shared_ptr<vmips::VirtReg>,std::allocator<std::shared_ptr<vmips::VirtReg>>>>
            ((void **)&calling,
             (Function **)
             &local_98.super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_98,
             (vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
              *)target);
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  ~vector(&local_48);
  lVar2 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_78._M_ptr + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != -8);
  lVar2 = *(long *)(this + 0x148);
  std::__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<vmips::callfunc,void>
            ((__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2> *)&local_78,
             &calling.super___shared_ptr<vmips::callfunc,_(__gnu_cxx::_Lock_policy)2>);
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(lVar2 + 0x30),(shared_ptr<vmips::Instruction> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&calling.super___shared_ptr<vmips::callfunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void call_void(std::weak_ptr<Function> target, Args &&... args) {
            has_sub = true;
            sub_argc = std::max(sub_argc, target.lock()->argc);
            auto calling = std::make_shared<callfunc>(nullptr, this, std::move(target),
                                                      std::vector<std::shared_ptr<VirtReg >>{
                                                              std::forward<Args>(args)...});
            cursor->instructions.push_back(calling);
        }